

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::Type> * __thiscall
capnp::compiler::Compiler::Node::resolveBootstrapType
          (Maybe<capnp::Type> *__return_storage_ptr__,Node *this,Reader type,Schema scope)

{
  Type TVar1;
  
  (__return_storage_ptr__->ptr).isSet = false;
  TVar1 = SchemaLoader::getType(&(this->module->compiler->workspace).bootstrapLoader,type,scope);
  (__return_storage_ptr__->ptr).field_1.value = TVar1;
  (__return_storage_ptr__->ptr).isSet = true;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type> Compiler::Node::resolveBootstrapType(schema::Type::Reader type, Schema scope) {
  // TODO(someday): Arguably should return null if the type or its dependencies are placeholders.

  kj::Maybe<Type> result;
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    result = module->getCompiler().getWorkspace().bootstrapLoader.getType(type, scope);
  })) {
    result = kj::none;
    if (!module->getErrorReporter().hadErrors()) {
      addError(kj::str("Internal compiler bug: Bootstrap schema failed to load:\n",
                       exception));
    }
  }
  return result;
}